

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v5::internal::write<wchar_t>
               (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,basic_buffer<wchar_t> *buf)

{
  long value;
  type tVar1;
  basic_buffer<wchar_t> *in_RSI;
  wchar_t *in_RDI;
  UnsignedStreamSize n;
  UnsignedStreamSize max_size;
  UnsignedStreamSize size;
  wchar_t *data;
  type local_38;
  ulong local_20;
  wchar_t *local_18;
  
  local_18 = basic_buffer<wchar_t>::data(in_RSI);
  local_20 = basic_buffer<wchar_t>::size(in_RSI);
  value = std::numeric_limits<long>::max();
  tVar1 = to_unsigned<long>(value);
  do {
    local_38 = tVar1;
    if (local_20 <= tVar1) {
      local_38 = local_20;
    }
    std::wostream::write(in_RDI,(long)local_18);
    local_18 = local_18 + local_38;
    local_20 = local_20 - local_38;
  } while (local_20 != 0);
  return;
}

Assistant:

void write(std::basic_ostream<Char> &os, basic_buffer<Char> &buf) {
  const Char *data = buf.data();
  typedef std::make_unsigned<std::streamsize>::type UnsignedStreamSize;
  UnsignedStreamSize size = buf.size();
  UnsignedStreamSize max_size =
      internal::to_unsigned((std::numeric_limits<std::streamsize>::max)());
  do {
    UnsignedStreamSize n = size <= max_size ? size : max_size;
    os.write(data, static_cast<std::streamsize>(n));
    data += n;
    size -= n;
  } while (size != 0);
}